

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instdb.cpp
# Opt level: O0

InstId asmjit::v1_14::InstNameUtils::find
                 (char *s,size_t len,InstNameIndex *nameIndex,uint32_t *nameTable,char *stringTable)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *nameOut;
  long lVar4;
  size_t bSize;
  long in_RDX;
  ulong in_RSI;
  char *in_RDI;
  int result;
  size_t nameSize;
  size_t instId;
  size_t lim;
  char nameData [32];
  size_t end;
  size_t base;
  uint32_t prefix;
  ulong local_70;
  char local_68 [16];
  char *in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffb4;
  ulong local_40;
  ulong local_18;
  
  if (in_RDI != (char *)0x0) {
    local_18 = in_RSI;
    if (in_RSI == 0xffffffffffffffff) {
      local_18 = strlen(in_RDI);
    }
    bVar1 = true;
    if (local_18 != 0) {
      bVar1 = *(ushort *)(in_RDX + 0x68) < local_18;
    }
    if ((!bVar1) && (uVar2 = (int)*in_RDI - 0x61, uVar2 < 0x1a)) {
      local_40 = (ulong)*(ushort *)(in_RDX + (ulong)uVar2 * 4);
      nameOut = (char *)(ulong)*(ushort *)(in_RDX + 2 + (ulong)uVar2 * 4);
      if (local_40 != 0) {
        for (local_70 = (long)nameOut - local_40; local_70 != 0; local_70 = local_70 >> 1) {
          lVar4 = local_40 + (local_70 >> 1);
          bSize = decodeToBuffer(nameOut,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
          iVar3 = Support::compareStringViews(in_RDI,local_18,local_68,bSize);
          if (-1 < iVar3) {
            if (iVar3 < 1) {
              return (InstId)lVar4;
            }
            local_40 = lVar4 + 1;
            local_70 = local_70 - 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

InstId find(const char* s, size_t len, const InstNameIndex& nameIndex, const uint32_t* nameTable, const char* stringTable) noexcept {
  if (ASMJIT_UNLIKELY(!s))
    return BaseInst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > nameIndex.maxNameLength))
    return BaseInst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return BaseInst::kIdNone;

  size_t base = nameIndex.data[prefix].start;
  size_t end = nameIndex.data[prefix].end;

  if (ASMJIT_UNLIKELY(!base))
    return BaseInst::kIdNone;

  char nameData[kBufferSize];
  for (size_t lim = end - base; lim != 0; lim >>= 1) {
    size_t instId = base + (lim >> 1);
    size_t nameSize = decodeToBuffer(nameData, nameTable[instId], stringTable);

    int result = Support::compareStringViews(s, len, nameData, nameSize);
    if (result < 0)
      continue;

    if (result > 0) {
      base = instId + 1;
      lim--;
      continue;
    }

    return InstId(instId);
  }

  return BaseInst::kIdNone;
}